

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall helics::BrokerBase::baseConfigure(BrokerBase *this,ActionMessage *command)

{
  bool bVar1;
  action_t aVar2;
  ActionMessage *in_RSI;
  long in_RDI;
  undefined1 in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  int iVar4;
  
  aVar2 = ActionMessage::action(in_RSI);
  if (aVar2 == cmd_base_configure) {
    iVar4 = in_RSI->messageID;
    if (iVar4 == 0x58) {
      bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,indicator_flag);
      uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe0);
      CLI::std::__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x51c120);
      CLI::std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(iVar4,uVar3),(bool)in_stack_ffffffffffffffdf);
    }
    else if (iVar4 == 0x59) {
      bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,indicator_flag);
      *(bool *)(in_RDI + 0xda) = bVar1;
    }
  }
  return;
}

Assistant:

void BrokerBase::baseConfigure(ActionMessage& command)
{
    if (command.action() == CMD_BASE_CONFIGURE) {
        switch (command.messageID) {
            case HELICS_FLAG_DUMPLOG:
                dumplog = checkActionFlag(command, indicator_flag);
                break;
            case HELICS_FLAG_FORCE_LOGGING_FLUSH:
                mLogManager->forceLoggingFlush = checkActionFlag(command, indicator_flag);
                break;
            default:
                break;
        }
    }
}